

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O1

_Bool find_affine(Correspondence *points,int *indices,int num_indices,double *params)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  int iVar4;
  bool bVar5;
  double *pdVar6;
  double *pdVar7;
  undefined1 *puVar8;
  int i;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  int i_1;
  double *pdVar15;
  double *pdVar16;
  int j;
  long lVar17;
  double dVar18;
  double mat [2] [9];
  double local_138 [9];
  double local_f0 [3];
  double local_d8 [11];
  double y [2] [3];
  double adStack_48 [6];
  undefined1 local_18 [8];
  
  pdVar6 = y[1] + 1;
  local_d8[6] = 0.0;
  local_d8[7] = 0.0;
  local_d8[8] = 0.0;
  local_d8[9] = 0.0;
  local_d8[10] = 0.0;
  y[0][0] = 0.0;
  y[0][1] = 0.0;
  y[0][2] = 0.0;
  y[1][0] = 0.0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  y[1][1] = 0.0;
  y[1][2] = 0.0;
  adStack_48[0] = 0.0;
  adStack_48[1] = 0.0;
  adStack_48[2] = 0.0;
  adStack_48[3] = 0.0;
  adStack_48[4] = 0.0;
  adStack_48[5] = 0.0;
  local_138[3] = 0.0;
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  if (0 < num_indices) {
    uVar13 = 0;
    do {
      iVar4 = indices[uVar13];
      local_138[7] = points[iVar4].x;
      local_138[8] = points[iVar4].y;
      dVar18 = points[iVar4].rx;
      dVar1 = points[iVar4].ry;
      local_138[6] = 1.0;
      lVar9 = 0;
      pdVar7 = local_138 + 0x12;
      do {
        dVar2 = local_138[lVar9 + 6];
        lVar17 = 0;
        do {
          pdVar7[lVar17] = local_138[lVar17 + 6] * dVar2 + pdVar7[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        lVar9 = lVar9 + 1;
        pdVar7 = pdVar7 + 3;
      } while (lVar9 != 3);
      lVar9 = 0;
      do {
        local_138[lVar9] = local_138[lVar9 + 6] * dVar18 + local_138[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      local_f0[0] = 1.0;
      local_f0[1] = local_138[7];
      local_f0[2] = local_138[8];
      lVar9 = 0;
      pdVar7 = pdVar6;
      do {
        dVar18 = local_138[lVar9 + 9];
        lVar17 = 0;
        do {
          pdVar7[lVar17] = local_138[lVar17 + 9] * dVar18 + pdVar7[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        lVar9 = lVar9 + 1;
        pdVar7 = pdVar7 + 3;
      } while (lVar9 != 3);
      lVar9 = 0;
      do {
        local_138[lVar9 + 3] = local_138[lVar9 + 9] * dVar1 + local_138[lVar9 + 3];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)num_indices);
  }
  pdVar7 = local_138 + 0x12;
  pdVar12 = local_138 + 0x15;
  uVar13 = 0;
  do {
    uVar10 = 2;
    pdVar15 = y[0] + 1;
    do {
      uVar14 = uVar10 - 1;
      if (ABS(y[uVar10 - 3][uVar13 + 1]) < ABS(y[uVar10 - 2][uVar13 + 1])) {
        lVar9 = -0x18;
        do {
          uVar3 = *(undefined8 *)((long)pdVar15 + lVar9 + 0x18);
          *(undefined8 *)((long)pdVar15 + lVar9 + 0x18) = *(undefined8 *)((long)pdVar15 + lVar9);
          *(undefined8 *)((long)pdVar15 + lVar9) = uVar3;
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0);
        dVar18 = local_138[uVar14];
        local_138[uVar14] = local_138[uVar10];
        local_138[uVar10] = dVar18;
      }
      pdVar15 = pdVar15 + -3;
      uVar11 = uVar13;
      uVar10 = uVar14;
      pdVar16 = pdVar12;
    } while (uVar13 < uVar14);
    do {
      dVar18 = *(double *)((long)y + uVar13 * 0x20 + -0x28);
      if (ABS(dVar18) < 1e-16) {
        return false;
      }
      uVar10 = uVar11 + 1;
      dVar18 = -y[uVar11 - 1][uVar13 + 1] / dVar18;
      lVar9 = 0;
      do {
        pdVar16[lVar9] = pdVar7[lVar9] * dVar18 + pdVar16[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      local_138[uVar10] = dVar18 * local_138[uVar13] + local_138[uVar10];
      uVar11 = uVar10;
      pdVar16 = pdVar16 + 3;
    } while (uVar10 != 2);
    uVar13 = uVar13 + 1;
    pdVar7 = pdVar7 + 3;
    pdVar12 = pdVar12 + 3;
  } while (uVar13 != 2);
  pdVar7 = local_138 + 0xf;
  lVar9 = 0;
  pdVar12 = pdVar6;
  uVar13 = 3;
  do {
    uVar10 = uVar13 - 1;
    if (ABS(local_138[(ulong)(uint)((int)uVar10 * 4) + 0x12]) < 1e-16) {
      return false;
    }
    dVar18 = 0.0;
    if (uVar13 < 3) {
      lVar17 = 0;
      do {
        dVar18 = dVar18 + pdVar12[lVar17] * pdVar7[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar9 != lVar17);
    }
    local_138[uVar13 + 0xb] =
         (local_138[uVar10] - dVar18) / local_138[(ulong)(uint)((int)uVar10 * 4) + 0x12];
    lVar9 = lVar9 + 1;
    pdVar7 = pdVar7 + -1;
    pdVar12 = pdVar12 + -4;
    bVar5 = 1 < uVar13;
    uVar13 = uVar10;
  } while (bVar5);
  pdVar7 = adStack_48;
  uVar13 = 0;
  pdVar12 = pdVar6;
  do {
    uVar10 = 2;
    pdVar15 = adStack_48 + 3;
    do {
      uVar14 = uVar10 - 1;
      if (ABS(y[uVar10][uVar13 + 1]) < ABS(pdVar6[uVar13 + uVar10 * 3])) {
        lVar9 = -0x18;
        do {
          uVar3 = *(undefined8 *)((long)pdVar15 + lVar9 + 0x18);
          *(undefined8 *)((long)pdVar15 + lVar9 + 0x18) = *(undefined8 *)((long)pdVar15 + lVar9);
          *(undefined8 *)((long)pdVar15 + lVar9) = uVar3;
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0);
        dVar18 = local_138[uVar10 + 2];
        local_138[uVar10 + 2] = local_138[uVar10 + 3];
        local_138[uVar10 + 3] = dVar18;
      }
      pdVar15 = pdVar15 + -3;
      uVar11 = uVar13;
      uVar10 = uVar14;
      pdVar16 = pdVar7;
    } while (uVar13 < uVar14);
    do {
      if (ABS(pdVar6[uVar13 * 4]) < 1e-16) {
        return false;
      }
      uVar10 = uVar11 + 1;
      dVar18 = -pdVar6[uVar13 + uVar10 * 3] / pdVar6[uVar13 * 4];
      lVar9 = 0;
      do {
        pdVar16[lVar9] = pdVar12[lVar9] * dVar18 + pdVar16[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      local_138[uVar11 + 4] = dVar18 * local_138[uVar13 + 3] + local_138[uVar11 + 4];
      uVar11 = uVar10;
      pdVar16 = pdVar16 + 3;
    } while (uVar10 != 2);
    uVar13 = uVar13 + 1;
    pdVar12 = pdVar12 + 3;
    pdVar7 = pdVar7 + 3;
  } while (uVar13 != 2);
  pdVar6 = local_138 + 0x12;
  puVar8 = local_18;
  lVar9 = 0;
  uVar13 = 3;
  do {
    if (ABS(y[1][(ulong)(uint)((int)(uVar13 - 1) * 4) + 1]) < 1e-16) {
      return false;
    }
    dVar18 = 0.0;
    if (uVar13 < 3) {
      lVar17 = 0;
      do {
        dVar18 = dVar18 + *(double *)(puVar8 + lVar17 * 8) * pdVar6[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar9 != lVar17);
    }
    local_138[uVar13 + 0xe] =
         (local_138[uVar13 + 2] - dVar18) / y[1][(ulong)(uint)((int)(uVar13 - 1) * 4) + 1];
    lVar9 = lVar9 + 1;
    pdVar6 = pdVar6 + -1;
    puVar8 = puVar8 + -0x20;
    bVar5 = 1 < uVar13;
    uVar13 = uVar13 - 1;
  } while (bVar5);
  *params = local_d8[0];
  params[1] = local_d8[3];
  params[2] = local_d8[1];
  params[3] = local_d8[2];
  params[4] = local_d8[4];
  params[5] = local_d8[5];
  return true;
}

Assistant:

static bool find_affine(const Correspondence *points, const int *indices,
                        int num_indices, double *params) {
  // Note: The least squares problem for affine models is 6-dimensional,
  // but it splits into two independent 3-dimensional subproblems.
  // Solving these two subproblems separately and recombining at the end
  // results in less total computation than solving the 6-dimensional
  // problem directly.
  //
  // The two subproblems correspond to all the parameters which contribute
  // to the x output of the model, and all the parameters which contribute
  // to the y output, respectively.

  const int n = 3;       // Size of each least-squares problem
  double mat[2][3 * 3];  // Accumulator for A'A
  double y[2][3];        // Accumulator for A'b
  double x[2][3];        // Output vector
  double a[2][3];        // Single row of A
  double b[2];           // Single element of b

  least_squares_init(mat[0], y[0], n);
  least_squares_init(mat[1], y[1], n);
  for (int i = 0; i < num_indices; ++i) {
    int index = indices[i];
    const double sx = points[index].x;
    const double sy = points[index].y;
    const double dx = points[index].rx;
    const double dy = points[index].ry;

    a[0][0] = 1;
    a[0][1] = sx;
    a[0][2] = sy;
    b[0] = dx;
    least_squares_accumulate(mat[0], y[0], a[0], b[0], n);

    a[1][0] = 1;
    a[1][1] = sx;
    a[1][2] = sy;
    b[1] = dy;
    least_squares_accumulate(mat[1], y[1], a[1], b[1], n);
  }

  if (!least_squares_solve(mat[0], y[0], x[0], n)) {
    return false;
  }
  if (!least_squares_solve(mat[1], y[1], x[1], n)) {
    return false;
  }

  // Rearrange least squares result to form output model
  params[0] = x[0][0];
  params[1] = x[1][0];
  params[2] = x[0][1];
  params[3] = x[0][2];
  params[4] = x[1][1];
  params[5] = x[1][2];

  return true;
}